

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Optimizer::Optimizer(Optimizer *this,Optimizer *from)

{
  AdamOptimizer *this_00;
  SGDOptimizer *this_01;
  undefined1 *puVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Optimizer_00402428;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    this_01 = _internal_mutable_sgdoptimizer(this);
    if (from->_oneof_case_[0] == 10) {
      puVar1 = (undefined1 *)(from->OptimizerType_).sgdoptimizer_;
    }
    else {
      puVar1 = _SGDOptimizer_default_instance_;
    }
    SGDOptimizer::MergeFrom(this_01,(SGDOptimizer *)puVar1);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    this_00 = _internal_mutable_adamoptimizer(this);
    if (from->_oneof_case_[0] == 0xb) {
      puVar1 = (undefined1 *)(from->OptimizerType_).adamoptimizer_;
    }
    else {
      puVar1 = _AdamOptimizer_default_instance_;
    }
    AdamOptimizer::MergeFrom(this_00,(AdamOptimizer *)puVar1);
  }
  return;
}

Assistant:

Optimizer::Optimizer(const Optimizer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_OptimizerType();
  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      _internal_mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from._internal_sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      _internal_mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from._internal_adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Optimizer)
}